

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  MainLoop *this;
  MainLoop *this_00;
  MainLoop *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  this = (MainLoop *)&local_18;
  this_00 = (MainLoop *)&local_18;
  MainLoop::Init();
  MainLoop::SetRunCondition(this,main::anon_class_1_0_00000001::__invoke);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  MainLoop::Init();
  MainLoop::AddToDelayedUpdate(this_00,main::anon_class_1_0_00000001::__invoke);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  MainLoop::Init();
  MainLoop::Run(local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return 0;
}

Assistant:

int main()
{
  static bool keepRunning = true;
  MainLoop::Get()->SetRunCondition([]() -> bool { return keepRunning; });
  MainLoop::Get()->AddToDelayedUpdate([]() {
    static int count = 0;
    count++;
    if (count > 10)
      keepRunning = false;
    std::cout << "update!\n"; 
    });
  MainLoop::Get()->Run();
  return 0;
}